

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianPoint::~IfcCartesianPoint(IfcCartesianPoint *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].super_IfcPoint.field_0x40 = &PTR__IfcCartesianPoint_0085a2d0;
  *(undefined ***)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x28 =
       &PTR__IfcCartesianPoint_0085a370;
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcCartesianPoint_0085a2f8;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcCartesianPoint_0085a320;
  (this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCartesianPoint_0085a348;
  pvVar1 = *(void **)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.
                      super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcPoint.field_0x40,0x70);
  return;
}

Assistant:

IfcCartesianPoint() : Object("IfcCartesianPoint") {}